

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

bool __thiscall QSQLiteResult::execBatch(QSQLiteResult *this,bool arrayBind)

{
  QList<QVariant> *this_00;
  byte bVar1;
  QHash<QString,_QList<int>_> QVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QVariant *pQVar5;
  ulong uVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  ulong local_c0;
  QHash<QString,_QList<int>_> aQStack_a0 [2];
  QArrayDataPointer<QVariant> local_90;
  QList<QVariant> *local_78;
  QArrayDataPointer<QVariant> QStack_70;
  QArrayDataPointer<QVariant> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = *(long *)&this->field_0x8;
  this_00 = (QList<QVariant> *)(lVar9 + 0x60);
  QStack_70.d = *(Data **)(lVar9 + 0x60);
  QStack_70.ptr = *(QVariant **)(lVar9 + 0x68);
  QStack_70.size = *(qsizetype *)(lVar9 + 0x70);
  if (QStack_70.d != (Data *)0x0) {
    LOCK();
    ((QStack_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d = *(Data **)(lVar9 + 0x60);
  local_58.ptr = *(QVariant **)(lVar9 + 0x68);
  local_58.size = *(long *)(lVar9 + 0x70);
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78 = this_00;
  if (local_58.size == 0) {
    bVar12 = false;
  }
  else {
    QVariant::toList();
    qVar3 = local_90.size;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
    bVar12 = qVar3 == 0;
    if (!bVar12) {
      plVar10 = (long *)(lVar9 + 0x78);
      local_c0 = 0;
      do {
        QList<QVariant>::clear(this_00);
        aQStack_a0[0].d = (Data *)*plVar10;
        if ((aQStack_a0[0].d != (Data *)0x0) && (*(int *)aQStack_a0[0].d != -1)) {
          LOCK();
          *(int *)aQStack_a0[0].d = *(int *)aQStack_a0[0].d + 1;
          UNLOCK();
        }
        lVar9 = *plVar10;
        if (lVar9 == 0) {
LAB_00113538:
          lVar9 = 0;
LAB_0011353a:
          uVar11 = 0;
        }
        else {
          if (**(char **)(lVar9 + 0x20) != -1) goto LAB_0011353a;
          uVar6 = 1;
          do {
            uVar11 = uVar6;
            if (*(ulong *)(lVar9 + 0x10) == uVar11) goto LAB_00113538;
            uVar6 = uVar11 + 1;
          } while ((*(char **)(lVar9 + 0x20))[(ulong)((uint)uVar11 & 0x7f) + (uVar11 >> 7) * 0x90]
                   == -1);
        }
joined_r0x00113540:
        if ((uVar11 != 0) || (lVar9 != 0)) {
          lVar8 = (uVar11 >> 7) * 0x90;
          bVar1 = *(byte *)((ulong)((uint)uVar11 & 0x7f) + *(long *)(lVar9 + 0x20) + lVar8);
          lVar8 = *(long *)(*(long *)(lVar9 + 0x20) + 0x80 + lVar8);
          QVariant::toList();
          (**(code **)(*(long *)this + 0x68))
                    (this,(ulong)((uint)bVar1 * 0x30) + lVar8,local_90.ptr + local_c0,1);
          QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
          do {
            if (*(long *)(lVar9 + 0x10) - 1U == uVar11) {
              uVar11 = 0;
              lVar9 = 0;
              break;
            }
            uVar11 = uVar11 + 1;
          } while (*(char *)((ulong)((uint)uVar11 & 0x7f) +
                            (uVar11 >> 7) * 0x90 + *(long *)(lVar9 + 0x20)) == -1);
          goto joined_r0x00113540;
        }
        cVar7 = (**(code **)(*(long *)this + 0x48))(this);
        QVar2.d = aQStack_a0[0].d;
        aQStack_a0[0].d = (Data *)0x0;
        local_90.d = (Data *)*plVar10;
        *plVar10 = (long)QVar2.d;
        QHash<QString,_QList<int>_>::~QHash((QHash<QString,_QList<int>_> *)&local_90);
        QHash<QString,_QList<int>_>::~QHash(aQStack_a0);
        if (cVar7 == '\0') break;
        local_c0 = local_c0 + 1;
        QVariant::toList();
        qVar3 = local_90.size;
        QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
        bVar12 = (ulong)qVar3 <= local_c0;
      } while (local_c0 < (ulong)qVar3);
    }
  }
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_58);
  qVar3 = QStack_70.size;
  pQVar5 = QStack_70.ptr;
  pDVar4 = QStack_70.d;
  QStack_70.d = (Data *)0x0;
  QStack_70.ptr = (QVariant *)0x0;
  QStack_70.size = 0;
  local_58.d = (local_78->d).d;
  local_58.ptr = (local_78->d).ptr;
  (local_78->d).d = pDVar4;
  (local_78->d).ptr = pQVar5;
  local_58.size = (local_78->d).size;
  (local_78->d).size = qVar3;
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&QStack_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::execBatch(bool arrayBind)
{
    Q_UNUSED(arrayBind);
    Q_D(QSqlResult);
    QScopedValueRollback<QList<QVariant>> valuesScope(d->values);
    QList<QVariant> values = d->values;
    if (values.size() == 0)
        return false;

    for (int i = 0; i < values.at(0).toList().size(); ++i) {
        d->values.clear();
        QScopedValueRollback<QHash<QString, QList<int>>> indexesScope(d->indexes);
        auto it = d->indexes.constBegin();
        while (it != d->indexes.constEnd()) {
            bindValue(it.key(), values.at(it.value().first()).toList().at(i), QSql::In);
            ++it;
        }
        if (!exec())
            return false;
    }
    return true;
}